

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::Image::GLES2ImageApi::ModifyRenderbufferClearStencil::initializeRbo
          (ModifyRenderbufferClearStencil *this,GLES2ImageApi *api,GLuint renderbuffer,
          Texture2D *reference)

{
  Functions *gl;
  GLenum GVar1;
  
  gl = api->m_gl;
  framebufferRenderbuffer(gl,0x8d20,renderbuffer);
  (*gl->viewport)(0,0,reference->m_width,reference->m_height);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"viewport(0, 0, reference.getWidth(), reference.getHeight())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x353);
  (*gl->clearStencil)(this->m_stencil);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"clearStencil(m_stencil)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x354);
  (*gl->clear)(0x400);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"clear(GL_STENCIL_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                  ,0x355);
  tcu::clearStencil((reference->super_TextureLevelPyramid).m_access.
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,this->m_stencil);
  return;
}

Assistant:

void GLES2ImageApi::ModifyRenderbufferClearStencil::initializeRbo (GLES2ImageApi& api, GLuint renderbuffer, tcu::Texture2D& reference) const
{
	const glw::Functions&	gl		= api.m_gl;

	framebufferRenderbuffer(gl, GL_STENCIL_ATTACHMENT, renderbuffer);

	GLU_CHECK_GLW_CALL(gl, viewport(0, 0, reference.getWidth(), reference.getHeight()));
	GLU_CHECK_GLW_CALL(gl, clearStencil(m_stencil));
	GLU_CHECK_GLW_CALL(gl, clear(GL_STENCIL_BUFFER_BIT));

	tcu::clearStencil(reference.getLevel(0), m_stencil);
}